

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_4_method_stmt(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *n2;
  PVIPNode **ppPVar1;
  PVIPNode *pPVar2;
  
  ppPVar1 = G->val;
  pPVar2 = ppPVar1[-3];
  n2 = ppPVar1[-2];
  if (n2 == (PVIPNode *)0x0) {
    n2 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
    ppPVar1 = G->val;
  }
  pPVar2 = PVIP_node_new_children3(&G->data,PVIP_NODE_SUBMETHOD,pPVar2,n2,ppPVar1[-1]);
  G->ss = pPVar2;
  return;
}

Assistant:

YY_ACTION(void) yy_4_method_stmt(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define p G->val[-2]
#define i G->val[-3]
  yyprintf((stderr, "do yy_4_method_stmt"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_SUBMETHOD, i, MAYBE(p), b); }\n"));
  yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_SUBMETHOD, i, MAYBE(p), b); ;
#undef b
#undef p
#undef i
}